

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O2

void __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::FindClosestPointsOptimized
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this)

{
  CellQueue *this_00;
  bool seek;
  const_reference pQVar1;
  S2CellId id;
  int iVar2;
  bool bVar3;
  QueueEntry entry;
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  local_140;
  
  InitQueue(this);
  this_00 = &this->queue_;
  while( true ) {
    if ((this_00->c).allocator_and_tag_.tag_.size_ < 2) {
      return;
    }
    pQVar1 = absl::
             InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
             ::front(&this_00->c);
    entry.distance.super_S1ChordAngle.length2_ =
         (S1ChordAngle)(pQVar1->distance).super_S1ChordAngle.length2_;
    entry.id.id_ = (pQVar1->id).id_;
    std::
    priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
    ::pop(this_00);
    if ((this->distance_limit_).super_S1ChordAngle.length2_ <=
        (double)entry.distance.super_S1ChordAngle.length2_) break;
    id = S2CellId::child_begin(&entry.id);
    seek = true;
    iVar2 = 4;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      seek = ProcessOrEnqueue(this,id,&this->iter_,seek);
      id.id_ = id.id_ + (-id.id_ & id.id_) * 2;
    }
  }
  local_140.allocator_and_tag_.tag_.size_ = (Tag)0;
  absl::
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  ::operator=(&this_00->c,&local_140);
  absl::
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  ::clear(&local_140);
  return;
}

Assistant:

void S2ClosestPointQueryBase<Distance, Data>::FindClosestPointsOptimized() {
  InitQueue();
  while (!queue_.empty()) {
    // We need to copy the top entry before removing it, and we need to remove
    // it before adding any new entries to the queue.
    QueueEntry entry = queue_.top();
    queue_.pop();
    // Work around weird parse error in gcc 4.9 by using a local variable for
    // entry.distance.
    Distance distance = entry.distance;
    if (!(distance < distance_limit_)) {
      queue_ = CellQueue();  // Clear any remaining entries.
      break;
    }
    S2CellId child = entry.id.child_begin();
    // We already know that it has too many points, so process its children.
    // Each child may either be processed directly or enqueued again.  The
    // loop is optimized so that we don't seek unnecessarily.
    bool seek = true;
    for (int i = 0; i < 4; ++i, child = child.next()) {
      seek = ProcessOrEnqueue(child, &iter_, seek);
    }
  }
}